

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas.cpp
# Opt level: O1

bool duckdb::PatasCompressionFun::TypeIsSupported(PhysicalType physical_type)

{
  return (byte)(physical_type - FLOAT) < 2;
}

Assistant:

bool PatasCompressionFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return true;
	default:
		return false;
	}
}